

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

smart_ptr<re2c::DFA> __thiscall
re2c::compile(re2c *this,Spec *spec,Output *output,string *cond,uint32_t cunits)

{
  _Rb_tree_header *p_Var1;
  uint32_t dfa_line;
  ostream *poVar2;
  _Base_ptr p_Var3;
  Skeleton *this_00;
  DFA *this_01;
  ulong uVar4;
  long *extraout_RDX;
  smart_ptr<re2c::DFA> sVar5;
  uint32_t cunits_local;
  charset_t cs;
  dfa_t dfa;
  string name;
  vector<unsigned_long,_std::allocator<unsigned_long>_> fill;
  nfa_t nfa;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> bounds;
  
  cunits_local = cunits;
  dfa_line = OutputFile::get_block_line(&output->source);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&bounds);
  poVar2 = std::operator<<((ostream *)&bounds,"line");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  p_Var1 = &bounds._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::stringbuf::str();
  if (cond->_M_string_length != 0) {
    std::__cxx11::string::append((char *)&name);
    std::__cxx11::string::append((string *)&name);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bounds);
  bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bounds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (*spec->re->_vptr_RegExp[2])(spec->re,&bounds);
  dfa.states.super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_insert_unique<unsigned_int>(&bounds._M_t,(uint *)&dfa);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&bounds,&cunits_local);
  cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  for (p_Var3 = bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&cs,&p_Var3[1]._M_color);
  }
  nfa_t::nfa_t(&nfa,spec->re);
  dfa_t::dfa_t(&dfa,&nfa,&cs,&spec->rules);
  this_00 = (Skeleton *)operator_new(0x90);
  Skeleton::Skeleton(this_00,&dfa,&cs,&spec->rules,&name,cond,dfa_line);
  minimization(&dfa);
  fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fillpoints(&dfa,&fill);
  this_01 = (DFA *)operator_new(0x88);
  DFA::DFA(this_01,&dfa,&fill,this_00,&cs,&name,cond,dfa_line);
  DFA::reorder(this_01);
  DFA::prepare(this_01);
  DFA::calc_stats(this_01);
  uVar4 = this_01->max_fill;
  if (this_01->max_fill < output->max_fill) {
    uVar4 = output->max_fill;
  }
  output->max_fill = uVar4;
  if (this_01->need_accept == true) {
    OutputFile::set_used_yyaccept(&output->source);
  }
  smart_ptr<re2c::DFA>::smart_ptr((smart_ptr<re2c::DFA> *)this,this_01);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&fill.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  dfa_t::~dfa_t(&dfa);
  nfa_t::~nfa_t(&nfa);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&cs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&bounds._M_t);
  std::__cxx11::string::~string((string *)&name);
  sVar5.count = extraout_RDX;
  sVar5.ptr = (DFA *)this;
  return sVar5;
}

Assistant:

smart_ptr<DFA> compile (Spec & spec, Output & output, const std::string & cond, uint32_t cunits)
{
	const uint32_t line = output.source.get_block_line();
	const std::string name = make_name(cond, line);

	// The original set of code units (charset) might be very large.
	// A common trick it is to split charset into disjoint character ranges
	// and choose a representative of each range (we choose lower bound).
	// The set of all representatives is the new (compacted) charset.
	// Don't forget to include zero and upper bound, even if they
	// do not explicitely apper in ranges.
	std::set<uint32_t> bounds;
	spec.re->split(bounds);
	bounds.insert(0);
	bounds.insert(cunits);
	charset_t cs;
	for (std::set<uint32_t>::const_iterator i = bounds.begin(); i != bounds.end(); ++i)
	{
		cs.push_back(*i);
	}

	nfa_t nfa(spec.re);

	dfa_t dfa(nfa, cs, spec.rules);

	// skeleton must be constructed after DFA construction
	// but prior to any other DFA transformations
	Skeleton *skeleton = new Skeleton(dfa, cs, spec.rules, name, cond, line);

	minimization(dfa);

	// find YYFILL states and calculate argument to YYFILL
	std::vector<size_t> fill;
	fillpoints(dfa, fill);

	// ADFA stands for 'DFA with actions'
	DFA *adfa = new DFA(dfa, fill, skeleton, cs, name, cond, line);

	/*
	 * note [reordering DFA states]
	 *
	 * re2c-generated code depends on the order of states in DFA: simply
	 * flipping two states may change the output significantly.
	 * The order of states is affected by many factors, e.g.:
	 *   - flipping left and right subtrees of alternative when constructing
	 *     AST (also applies to iteration and counted repetition)
	 *   - changing the order in which graph nodes are visited (applies to
	 *     any intermediate representation: bytecode, NFA, DFA, etc.)
	 *
	 * To make the resulting code independent of such changes, we hereby
	 * reorder DFA states. The ordering scheme is very simple:
	 *
	 * Starting with DFA root, walk DFA nodes in breadth-first order.
	 * Child nodes are ordered accoding to the (alphabetically) first symbol
	 * leading to each node. Each node must be visited exactly once.
	 * Default state (NULL) is always the last state.
	 */
	adfa->reorder();

	// skeleton is constructed, do further DFA transformations
	adfa->prepare();

	// finally gather overall DFA statistics
	adfa->calc_stats();

	// accumulate global statistics from this particular DFA
	output.max_fill = std::max (output.max_fill, adfa->max_fill);
	if (adfa->need_accept)
	{
		output.source.set_used_yyaccept ();
	}

	return make_smart_ptr(adfa);
}